

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O2

void Curl_sock_assign_addr(Curl_sockaddr_ex *dest,Curl_addrinfo *ai,int transport)

{
  uint uVar1;
  undefined8 uVar2;
  
  dest->family = ai->ai_family;
  if (transport == 3) {
    uVar2 = 0x600000001;
  }
  else if (transport == 6) {
    uVar2 = 1;
  }
  else {
    uVar2 = 0x1100000002;
  }
  dest->socktype = (int)uVar2;
  dest->protocol = (int)((ulong)uVar2 >> 0x20);
  uVar1 = 0x80;
  if (ai->ai_addrlen < 0x80) {
    uVar1 = ai->ai_addrlen;
  }
  dest->addrlen = uVar1;
  memcpy(&dest->_sa_ex_u,ai->ai_addr,(ulong)uVar1);
  return;
}

Assistant:

void Curl_sock_assign_addr(struct Curl_sockaddr_ex *dest,
                           const struct Curl_addrinfo *ai,
                           int transport)
{
  /*
   * The Curl_sockaddr_ex structure is basically libcurl's external API
   * curl_sockaddr structure with enough space available to directly hold
   * any protocol-specific address structures. The variable declared here
   * will be used to pass / receive data to/from the fopensocket callback
   * if this has been set, before that, it is initialized from parameters.
   */
  dest->family = ai->ai_family;
  switch(transport) {
  case TRNSPRT_TCP:
    dest->socktype = SOCK_STREAM;
    dest->protocol = IPPROTO_TCP;
    break;
  case TRNSPRT_UNIX:
    dest->socktype = SOCK_STREAM;
    dest->protocol = IPPROTO_IP;
    break;
  default: /* UDP and QUIC */
    dest->socktype = SOCK_DGRAM;
    dest->protocol = IPPROTO_UDP;
    break;
  }
  dest->addrlen = (unsigned int)ai->ai_addrlen;

  if(dest->addrlen > sizeof(struct Curl_sockaddr_storage))
    dest->addrlen = sizeof(struct Curl_sockaddr_storage);
  memcpy(&dest->sa_addr, ai->ai_addr, dest->addrlen);
}